

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O2

void __thiscall wasm::SIMDLoadStoreLane::finalize(SIMDLoadStoreLane *this)

{
  bool bVar1;
  uintptr_t uVar2;
  
  if ((this->ptr != (Expression *)0x0) && (this->vec != (Expression *)0x0)) {
    bVar1 = isLoad(this);
    uVar2 = 6;
    if (!bVar1) {
      uVar2 = 0;
    }
    (this->super_SpecificExpression<(wasm::Expression::Id)35>).super_Expression.type.id = uVar2;
    if (((this->ptr->type).id == 1) || ((this->vec->type).id == 1)) {
      (this->super_SpecificExpression<(wasm::Expression::Id)35>).super_Expression.type.id = 1;
    }
    return;
  }
  __assert_fail("ptr && vec",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm.cpp"
                ,0x1f2,"void wasm::SIMDLoadStoreLane::finalize()");
}

Assistant:

void SIMDLoadStoreLane::finalize() {
  assert(ptr && vec);
  type = isLoad() ? Type::v128 : Type::none;
  if (ptr->type == Type::unreachable || vec->type == Type::unreachable) {
    type = Type::unreachable;
  }
}